

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProxy::IfcProxy(IfcProxy *this)

{
  *(undefined ***)&this->field_0x158 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcProxy";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__0090a200);
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x90a120;
  *(undefined8 *)&this->field_0x158 = 0x90a1e8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x90a148;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x90a170;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x90a198;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x90a1c0;
  *(undefined1 **)&(this->super_IfcProduct).field_0x110 = &this->field_0x120;
  *(undefined8 *)&this->field_0x118 = 0;
  this->field_0x120 = 0;
  (this->Tag).ptr._M_dataplus._M_p = (pointer)&(this->Tag).ptr.field_2;
  (this->Tag).ptr._M_string_length = 0;
  (this->Tag).ptr.field_2._M_local_buf[0] = '\0';
  (this->Tag).have = false;
  return;
}

Assistant:

IfcProxy() : Object("IfcProxy") {}